

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O2

HighsSplitDeque * __thiscall HighsTask::run(HighsTask *this,HighsSplitDeque *stealer)

{
  ulong uVar1;
  ulong uVar2;
  HighsSplitDeque *pHVar3;
  HighsSplitDeque *pHVar4;
  bool bVar5;
  
  uVar1 = (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  do {
    LOCK();
    uVar2 = (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
    bVar5 = uVar1 == uVar2;
    if (bVar5) {
      (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i = uVar1 | (ulong)stealer;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar5);
  if (uVar2 == 0) {
    (*(code *)**(undefined8 **)this->taskData)(this);
  }
  LOCK();
  uVar1 = (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i = 1;
  UNLOCK();
  pHVar4 = (HighsSplitDeque *)(uVar1 & 0xfffffffffffffffc);
  pHVar3 = (HighsSplitDeque *)0x0;
  if (pHVar4 != stealer) {
    pHVar3 = pHVar4;
  }
  return pHVar3;
}

Assistant:

HighsSplitDeque* run(HighsSplitDeque* stealer) {
    uintptr_t state = metadata.stealer.fetch_or(
        reinterpret_cast<uintptr_t>(stealer), std::memory_order_acquire);
    if (state == 0) getCallable()();

    return markAsFinished(stealer);
  }